

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  byte bVar1;
  char *pcVar2;
  ssl_primary_config *dest_local;
  ssl_primary_config *source_local;
  
  dest->verifyhost = (_Bool)(source->verifyhost & 1);
  dest->verifypeer = (_Bool)(source->verifypeer & 1);
  dest->version = source->version;
  dest->version_max = source->version_max;
  if (source->CAfile == (char *)0x0) {
    dest->CAfile = (char *)0x0;
  }
  else {
    pcVar2 = (*Curl_cstrdup)(source->CAfile);
    dest->CAfile = pcVar2;
    if (dest->CAfile == (char *)0x0) {
      return false;
    }
  }
  if (source->CApath == (char *)0x0) {
    dest->CApath = (char *)0x0;
  }
  else {
    pcVar2 = (*Curl_cstrdup)(source->CApath);
    dest->CApath = pcVar2;
    if (dest->CApath == (char *)0x0) {
      return false;
    }
  }
  if (source->cipher_list == (char *)0x0) {
    dest->cipher_list = (char *)0x0;
  }
  else {
    pcVar2 = (*Curl_cstrdup)(source->cipher_list);
    dest->cipher_list = pcVar2;
    if (dest->cipher_list == (char *)0x0) {
      return false;
    }
  }
  if (source->egdsocket == (char *)0x0) {
    dest->egdsocket = (char *)0x0;
  }
  else {
    pcVar2 = (*Curl_cstrdup)(source->egdsocket);
    dest->egdsocket = pcVar2;
    if (dest->egdsocket == (char *)0x0) {
      return false;
    }
  }
  if (source->random_file == (char *)0x0) {
    dest->random_file = (char *)0x0;
  }
  else {
    pcVar2 = (*Curl_cstrdup)(source->random_file);
    dest->random_file = pcVar2;
    if (dest->random_file == (char *)0x0) {
      return false;
    }
  }
  if (source->clientcert == (char *)0x0) {
    dest->clientcert = (char *)0x0;
  }
  else {
    pcVar2 = (*Curl_cstrdup)(source->clientcert);
    dest->clientcert = pcVar2;
    if (dest->clientcert == (char *)0x0) {
      return false;
    }
  }
  if (dest->clientcert == (char *)0x0) {
    bVar1 = source->sessionid & 1;
  }
  else {
    bVar1 = 0;
  }
  dest->sessionid = bVar1 != 0;
  return true;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->verifyhost = source->verifyhost;
  dest->verifypeer = source->verifypeer;
  dest->version = source->version;
  dest->version_max = source->version_max;

  CLONE_STRING(CAfile);
  CLONE_STRING(CApath);
  CLONE_STRING(cipher_list);
  CLONE_STRING(egdsocket);
  CLONE_STRING(random_file);
  CLONE_STRING(clientcert);

  /* Disable dest sessionid cache if a client cert is used, CVE-2016-5419. */
  dest->sessionid = (dest->clientcert ? false : source->sessionid);
  return TRUE;
}